

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

InlinedFrame * __thiscall
Js::InlinedFrameWalker::GetFrameAtIndex(InlinedFrameWalker *this,int index)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  InlinedFrame *pIVar5;
  
  if (this->frames == (InlinedFrame **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x5d7,"(frames)","frames");
    if (!bVar2) goto LAB_00aee498;
    *puVar4 = 0;
  }
  iVar3 = this->frameCount;
  if (iVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x5d8,"(frameCount)","frameCount");
    if (!bVar2) {
LAB_00aee498:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    iVar3 = this->frameCount;
  }
  if (index < iVar3) {
    pIVar5 = this->frames[index];
  }
  else {
    pIVar5 = (InlinedFrame *)0x0;
  }
  return pIVar5;
}

Assistant:

InlinedFrameWalker::InlinedFrame *InlinedFrameWalker::GetFrameAtIndex(signed index) const
    {
        Assert(frames);
        Assert(frameCount);

        InlinedFrameWalker::InlinedFrame *frame = nullptr;
        if (index < frameCount)
        {
            frame = frames[index];
        }

        return frame;
    }